

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void printComponent(ComponentPtr *component,bool includeMaths)

{
  string local_38;
  byte local_11;
  ComponentPtr *pCStack_10;
  bool includeMaths_local;
  ComponentPtr *component_local;
  
  local_11 = includeMaths;
  pCStack_10 = component;
  std::__cxx11::string::string((string *)&local_38);
  printComponent(component,0xffffffffffffffff,&local_38,(bool)(local_11 & 1));
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void printComponent(const libcellml::ComponentPtr &component, bool includeMaths)
{
    printComponent(component, SIZE_MAX, {}, includeMaths);
}